

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp.cpp
# Opt level: O3

CompressionFunction *
duckdb::ChimpCompressionFun::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  code *pcVar1;
  InternalException *this;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  int iVar5;
  undefined7 in_register_00000031;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  string local_48;
  
  iVar5 = (int)CONCAT71(in_register_00000031,type);
  if (iVar5 == 0xb) {
    pcVar1 = ChimpSkip<float>;
    pcVar2 = ChimpFetchRow<float>;
    pcVar3 = ChimpScanPartial<float>;
    pcVar6 = ChimpScan<float>;
    pcVar7 = ChimpInitScan<float>;
    pcVar8 = ChimpFinalizeCompress<float>;
    pcVar9 = ChimpCompress<float>;
    pcVar4 = ChimpInitCompression<float>;
    pcVar11 = ChimpFinalAnalyze<float>;
    pcVar12 = ChimpAnalyze<float>;
    pcVar10 = ChimpInitAnalyze<float>;
  }
  else {
    if (iVar5 != 0xc) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unsupported type for Chimp","");
      InternalException::InternalException(this,&local_48);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar1 = ChimpSkip<double>;
    pcVar2 = ChimpFetchRow<double>;
    pcVar3 = ChimpScanPartial<double>;
    pcVar6 = ChimpScan<double>;
    pcVar7 = ChimpInitScan<double>;
    pcVar8 = ChimpFinalizeCompress<double>;
    pcVar9 = ChimpCompress<double>;
    pcVar4 = ChimpInitCompression<double>;
    pcVar11 = ChimpFinalAnalyze<double>;
    pcVar12 = ChimpAnalyze<double>;
    pcVar10 = ChimpInitAnalyze<double>;
  }
  __return_storage_ptr__->type = COMPRESSION_CHIMP;
  __return_storage_ptr__->data_type = type;
  __return_storage_ptr__->init_analyze = pcVar10;
  __return_storage_ptr__->analyze = pcVar12;
  __return_storage_ptr__->final_analyze = pcVar11;
  __return_storage_ptr__->init_compression = pcVar4;
  __return_storage_ptr__->compress = pcVar9;
  __return_storage_ptr__->compress_finalize = pcVar8;
  __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
  __return_storage_ptr__->init_scan = pcVar7;
  __return_storage_ptr__->scan_vector = pcVar6;
  __return_storage_ptr__->scan_partial = pcVar3;
  __return_storage_ptr__->select = (compression_select_t)0x0;
  __return_storage_ptr__->filter = (compression_filter_t)0x0;
  __return_storage_ptr__->fetch_row = pcVar2;
  __return_storage_ptr__->skip = pcVar1;
  __return_storage_ptr__->init_segment = (compression_init_segment_t)0x0;
  __return_storage_ptr__->init_append = (compression_init_append_t)0x0;
  __return_storage_ptr__->append = (compression_append_t)0x0;
  __return_storage_ptr__->finalize_append = (compression_finalize_append_t)0x0;
  __return_storage_ptr__->revert_append = (compression_revert_append_t)0x0;
  __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
  __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
  __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->get_segment_info + 1) = 0;
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction ChimpCompressionFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::FLOAT:
		return GetChimpFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetChimpFunction<double>(type);
	default:
		throw InternalException("Unsupported type for Chimp");
	}
}